

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
* anon_unknown.dwarf_5733c63::ParsePubkeyInner
            (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             *__return_storage_ptr__,uint32_t key_exp_index,Span<const_char> *sp,
            ParseScriptContext ctx,FlatSigningProvider *out,bool *apostrophe,string *error)

{
  short *psVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  pointer puVar4;
  tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  tVar5;
  void *pvVar6;
  bool bVar7;
  pointer *__ptr_2;
  undefined8 *puVar8;
  PubkeyProvider *pPVar9;
  ulong uVar10;
  pointer puVar11;
  pointer puVar12;
  pointer pvVar13;
  undefined8 uVar14;
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  long lVar15;
  ulong uVar16;
  uint32_t uVar17;
  ulong uVar18;
  pointer puVar19;
  undefined4 *puVar20;
  CExtPubKey *pCVar21;
  SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *this;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *this_00;
  pointer puVar22;
  pointer *__ptr;
  pointer pvVar23;
  pointer __p;
  long in_FS_OFFSET;
  byte bVar24;
  string_view str_00;
  string_view hex_str;
  string_view separators;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  paths;
  uchar fullkey [33];
  CExtPubKey extpubkey;
  CExtKey extkey;
  string str;
  pointer local_1f8;
  uint32_t local_1ec;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1d8;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> local_1c0;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_1a8;
  undefined1 local_188 [32];
  uchar local_168;
  uchar local_167 [79];
  uchar local_118;
  CExtPubKey local_10c;
  undefined1 local_98 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88 [2];
  undefined1 local_68 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_60;
  string local_58;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *local_38;
  
  bVar24 = 0;
  local_38 = *(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
               **)(in_FS_OFFSET + 0x28);
  local_1a8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10c.version[0] = 0x2f;
  separators._M_str = (char *)out;
  separators._M_len = (size_t)&local_10c;
  util::Split<Span<char_const>>(&local_1c0,(util *)sp,(Span<const_char> *)0x1,separators);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             (local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_data,
             (local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_data +
             (local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_size);
  if (local_58._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (error,0,error->_M_string_length,"No key provided",0xf);
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_00dabadf;
  }
  if ((long)local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x10) {
    str_00._M_str = local_58._M_dataplus._M_p;
    str_00._M_len = local_58._M_string_length;
    bVar7 = IsHex(str_00);
    if (bVar7) {
      hex_str._M_str = local_58._M_dataplus._M_p;
      hex_str._M_len = local_58._M_string_length;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,hex_str);
      CPubKey::Set<unsigned_char_const*>
                ((CPubKey *)&local_10c,(uchar *)CONCAT71(local_98._1_7_,local_98[0]),
                 (uchar *)local_90._M_t.
                          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                          _M_head_impl);
      args._M_head_impl =
           (array<unsigned_char,_32UL> *)((ulong)local_10c.version[0] & 0xfffffffffffffffe);
      if (((((char)args._M_head_impl == '\x02') || (7 < local_10c.version[0])) ||
          (args._M_head_impl = (array<unsigned_char,_32UL> *)0xd0,
          (0xd0U >> (local_10c.version[0] & 0x1f) & 1) == 0)) ||
         ((byte)(local_10c.version[0] - 2) < 3)) {
        bVar7 = CPubKey::IsFullyValid((CPubKey *)&local_10c);
        if (bVar7) {
          if ((P2SH < ctx) && ((local_10c.version[0] & 0xfe) != 2)) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,"Uncompressed keys are not allowed");
            goto LAB_00dabaaf;
          }
          puVar8 = (undefined8 *)operator_new(0x50);
          *(uint32_t *)(puVar8 + 1) = key_exp_index;
          *puVar8 = &PTR__PubkeyProvider_013bdd58;
          memcpy((void *)((long)puVar8 + 0xc),&local_10c,0x41);
          *(undefined1 *)((long)puVar8 + 0x4d) = 0;
          local_188[0] = (uchar)puVar8;
          local_188._1_7_ = (undefined7)((ulong)puVar8 >> 8);
          std::
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
          ::
          emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                    ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                      *)&local_1a8,
                     (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                      *)local_188);
          pvVar13 = (pointer)CONCAT71(local_188._1_7_,local_188[0]);
LAB_00daba12:
          if (pvVar13 != (pointer)0x0) {
            operator_delete(pvVar13,0x50);
          }
          (__return_storage_ptr__->
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start =
               local_1a8.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (__return_storage_ptr__->
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish =
               local_1a8.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_1a8.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1a8.
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1a8.
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1a8.
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        else {
          if ((ctx == P2TR) &&
             (tVar5.
              super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._1_7_ =
                   local_98._1_7_,
             tVar5.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ =
                  local_98[0],
             args._M_head_impl =
                  (array<unsigned_char,_32UL> *)
                  local_90._M_t.
                  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl,
             (long)local_90._M_t.
                   super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl -
             (long)tVar5.
                   super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
             0x20)) {
            local_188[1] = '\0';
            local_188[2] = '\0';
            local_188[3] = '\0';
            local_188[4] = '\0';
            local_188[5] = '\0';
            local_188[6] = '\0';
            local_188[7] = '\0';
            local_188[8] = '\0';
            local_188._9_7_ = 0;
            local_188[0x10] = '\0';
            local_188[0x11] = '\0';
            local_188[0x12] = '\0';
            local_188[0x13] = '\0';
            local_188[0x14] = '\0';
            local_188[0x15] = '\0';
            local_188[0x16] = '\0';
            local_188[0x17] = '\0';
            local_188[0x18] = '\0';
            local_188[0x19] = '\0';
            local_188[0x1a] = '\0';
            local_188[0x1b] = '\0';
            local_188[0x1c] = '\0';
            local_188[0x1d] = '\0';
            local_188[0x1e] = '\0';
            local_188[0x1f] = '\0';
            local_168 = '\0';
            local_188[0] = '\x02';
            if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 )local_90._M_t.
                  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
                (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)
                tVar5.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl) {
              local_188._17_7_ =
                   (undefined7)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)tVar5.
                              super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                              .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                              _M_head_impl + 0x10))->_M_allocated_capacity;
              local_188[0x18] =
                   (undefined1)
                   (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)((long)tVar5.
                               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                               _M_head_impl + 0x10))->_M_allocated_capacity >> 0x38);
              local_188._25_7_ =
                   (undefined7)
                   *(undefined8 *)
                    ((long)tVar5.
                           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                           _M_head_impl + 0x18);
              local_168 = (uchar)((ulong)*(undefined8 *)
                                          ((long)tVar5.
                                                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>
                                                 ._M_head_impl + 0x18) >> 0x38);
              local_188._1_7_ =
                   (undefined7)
                   *(undefined8 *)
                    tVar5.
                    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
              local_188[8] = (uchar)((ulong)*(undefined8 *)
                                             tVar5.
                                             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                                             .
                                             super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>
                                             ._M_head_impl >> 0x38);
              local_188._9_7_ =
                   (undefined7)
                   *(size_type *)
                    ((long)tVar5.
                           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                           _M_head_impl + 8);
              local_188[0x10] =
                   (undefined1)
                   (*(size_type *)
                     ((long)tVar5.
                            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                            _M_head_impl + 8) >> 0x38);
            }
            CPubKey::Set<unsigned_char*>((CPubKey *)&local_10c,local_188,local_167);
            bVar7 = CPubKey::IsFullyValid((CPubKey *)&local_10c);
            args._M_head_impl =
                 (array<unsigned_char,_32UL> *)
                 local_90._M_t.
                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
            if (bVar7) {
              pvVar13 = (pointer)operator_new(0x50);
              *(uint32_t *)
               &(pvVar13->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish = key_exp_index;
              (pvVar13->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = (pointer)&PTR__PubkeyProvider_013bdd58;
              memcpy((void *)((long)&(pvVar13->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + 4),&local_10c,
                     0x41);
              *(undefined1 *)
               ((long)&pvVar13[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + 5) = 1;
              local_1d8.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = pvVar13;
              std::
              vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
              ::
              emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                        ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                          *)&local_1a8,
                         (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                          *)&local_1d8);
              pvVar13 = local_1d8.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_00daba12;
            }
          }
          tinyformat::format<std::__cxx11::string>
                    ((string *)local_188,(tinyformat *)"Pubkey \'%s\' is invalid",(char *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     args._M_head_impl);
          _GLOBAL__N_1::ParsePubkeyInner();
        }
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (error,0,error->_M_string_length,"Hybrid public keys are not allowed",0x22);
LAB_00dabaaf:
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      pvVar6 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,local_88[0]._M_allocated_capacity - (long)pvVar6);
      }
      goto LAB_00dabadf;
    }
    DecodeSecret((string *)local_98);
    if (local_90._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
        (_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )0x0) goto LAB_00dab5ac;
    this = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_90;
    if ((ctx < P2WPKH) || (local_98[0] == true)) {
      CKey::GetPubKey((CPubKey *)&local_10c,(CKey *)local_98);
      CPubKey::GetID((CKeyID *)local_188,(CPubKey *)&local_10c);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
      ::_M_emplace_unique<CKeyID,CKey&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                  *)&out->keys,(CKeyID *)local_188,(CKey *)local_98);
      puVar8 = (undefined8 *)operator_new(0x50);
      *(uint32_t *)(puVar8 + 1) = key_exp_index;
      *puVar8 = &PTR__PubkeyProvider_013bdd58;
      memcpy((void *)((long)puVar8 + 0xc),&local_10c,0x41);
      *(bool *)((long)puVar8 + 0x4d) = ctx == P2TR;
      local_188[0] = (uchar)puVar8;
      local_188._1_7_ = (undefined7)((ulong)puVar8 >> 8);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
      ::
      emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                  *)&local_1a8,
                 (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                  *)local_188);
      if ((void *)CONCAT71(local_188._1_7_,local_188[0]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_188._1_7_,local_188[0]),0x50);
      }
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           local_1a8.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           local_1a8.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1a8.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1a8.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (error,"Uncompressed keys are not allowed");
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    local_60._M_head_impl =
         (array<unsigned_char,_32UL> *)
         local_90._M_t.
         super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )local_90._M_t.
          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )0x0) goto LAB_00dabadf;
  }
  else {
LAB_00dab5ac:
    DecodeExtKey((CExtKey *)local_98,&local_58);
    DecodeExtPubKey(&local_10c,&local_58);
    if ((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._M_head_impl
          == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)local_10c.pubkey.vch[0] & 0xfffffffffffffffe), (char)args_00 != '\x02'))
       && ((7 < local_10c.pubkey.vch[0] ||
           (args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd0,
           (0xd0U >> (local_10c.pubkey.vch[0] & 0x1f) & 1) == 0)))) {
      tinyformat::format<std::__cxx11::string>
                ((string *)local_188,(tinyformat *)"key \'%s\' is not valid",(char *)&local_58,
                 args_00);
      _GLOBAL__N_1::ParsePubkeyInner();
    }
    else {
      local_1d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar1 = (short *)local_1c0.
                        super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].m_data;
      local_1ec = 0;
      if (local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
          .super__Vector_impl_data._M_finish[-1].m_size == 2) {
        if ((*psVar1 == 0x272a) || (*psVar1 == 0x682a)) {
          *apostrophe = *psVar1 == 0x272a;
          uVar17 = 2;
          goto LAB_00dab66d;
        }
      }
      else if ((local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].m_size == 1) &&
              (uVar17 = 1, (char)*psVar1 == '*')) {
LAB_00dab66d:
        local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1;
        local_1ec = uVar17;
      }
      bVar7 = ParseKeyPath(&local_1c0,&local_1d8,apostrophe,error,true);
      if (bVar7) {
        if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             )local_60._M_head_impl !=
            (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             )0x0) {
          CExtKey::Neuter((CExtPubKey *)local_188,(CExtKey *)local_98);
          puVar20 = (undefined4 *)local_188;
          pCVar21 = &local_10c;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *(undefined4 *)pCVar21->version = *puVar20;
            puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
            pCVar21 = (CExtPubKey *)((long)pCVar21 + ((ulong)bVar24 * -2 + 1) * 4);
          }
          local_10c.pubkey.vch[0x40] = local_118;
          CPubKey::GetID((CKeyID *)local_188,&local_10c.pubkey);
          std::
          _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
          ::_M_emplace_unique<CKeyID,CKey&>
                    ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                      *)&out->keys,(CKeyID *)local_188,(CKey *)local_68);
        }
        pvVar13 = local_1d8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        puVar19 = (pointer)0x0;
        puVar22 = (pointer)0x0;
        if (local_1d8.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_1d8.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_1f8 = (pointer)0x0;
        }
        else {
          local_1f8 = (pointer)0x0;
          pvVar23 = local_1d8.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pPVar9 = (PubkeyProvider *)operator_new(0xa0);
            pp_Var2 = (_func_int **)
                      (pvVar23->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            pp_Var3 = (_func_int **)
                      (pvVar23->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar4 = (pvVar23->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            (pvVar23->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pvVar23->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pvVar23->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar7 = *apostrophe;
            pPVar9->m_expr_index = key_exp_index;
            pPVar9->_vptr_PubkeyProvider = (_func_int **)&PTR__BIP32PubkeyProvider_013bddf0;
            pCVar21 = &local_10c;
            puVar20 = (undefined4 *)&pPVar9->field_0xc;
            for (lVar15 = 0x1d; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar20 = *(undefined4 *)pCVar21->version;
              pCVar21 = (CExtPubKey *)((long)pCVar21 + ((ulong)bVar24 * -2 + 1) * 4);
              puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
            }
            pPVar9[8]._vptr_PubkeyProvider = pp_Var3;
            *(pointer *)&pPVar9[8].m_expr_index = puVar4;
            pPVar9[9]._vptr_PubkeyProvider = pp_Var2;
            pPVar9[9].m_expr_index = local_1ec;
            pPVar9[9].field_0xc = bVar7;
            local_188[0] = (uchar)pPVar9;
            local_188._1_7_ = (undefined7)((ulong)pPVar9 >> 8);
            if (puVar22 == puVar19) {
              uVar18 = (long)puVar19 - (long)local_1f8;
              if (uVar18 == 0x7ffffffffffffff8) {
                local_1a8.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = local_1f8;
                if (*(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      **)(in_FS_OFFSET + 0x28) == local_38) {
                  uVar14 = std::__throw_length_error("vector::_M_realloc_insert");
                  if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                       )local_60._M_head_impl !=
                      (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                       )0x0) {
                    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_60,
                               local_60._M_head_impl);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    local_58.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1c0.
                      super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_1c0.
                                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_1c0.
                                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_1c0.
                                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ::~vector(&local_1a8);
                  if (*(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        **)(in_FS_OFFSET + 0x28) == local_38) {
                    _Unwind_Resume(uVar14);
                  }
                }
                goto LAB_00dabdc2;
              }
              uVar10 = (long)uVar18 >> 3;
              uVar16 = uVar10;
              if (puVar19 == local_1f8) {
                uVar16 = 1;
              }
              this_00 = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                         *)(uVar16 + uVar10);
              if ((_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                   *)0xffffffffffffffe < this_00) {
                this_00 = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                           *)0xfffffffffffffff;
              }
              if (CARRY8(uVar16,uVar10)) {
                this_00 = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                           *)0xfffffffffffffff;
              }
              puVar11 = std::
                        _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        ::_M_allocate(this_00,(size_t)local_1f8);
              local_188[0] = '\0';
              local_188[1] = '\0';
              local_188[2] = '\0';
              local_188[3] = '\0';
              local_188[4] = '\0';
              local_188[5] = '\0';
              local_188[6] = '\0';
              local_188[7] = '\0';
              *(PubkeyProvider **)((long)puVar11 + uVar18) = pPVar9;
              puVar22 = puVar11;
              for (puVar12 = local_1f8; puVar19 != puVar12; puVar12 = puVar12 + 1) {
                (puVar22->_M_t).
                super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl
                     = (puVar12->_M_t).
                       super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                       .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
                       _M_head_impl;
                (puVar12->_M_t).
                super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl
                     = (PubkeyProvider *)0x0;
                puVar22 = puVar22 + 1;
              }
              if (local_1f8 != (pointer)0x0) {
                operator_delete(local_1f8,uVar18);
              }
              puVar19 = puVar11 + (long)this_00;
              local_1f8 = puVar11;
              local_1a8.
              super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar19;
            }
            else {
              local_188[0] = '\0';
              local_188[1] = '\0';
              local_188[2] = '\0';
              local_188[3] = '\0';
              local_188[4] = '\0';
              local_188[5] = '\0';
              local_188[6] = '\0';
              local_188[7] = '\0';
              (puVar22->_M_t).
              super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
              ._M_t.
              super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
              .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl =
                   pPVar9;
            }
            puVar22 = puVar22 + 1;
            local_1a8.
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = puVar22;
            std::
            unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
                           *)local_188);
            pvVar23 = pvVar23 + 1;
          } while (pvVar23 != pvVar13);
        }
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = local_1f8;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = puVar22;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = puVar19;
        __return_storage_ptr__ = &local_1a8;
      }
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_1d8);
    }
    if (local_60._M_head_impl == (array<unsigned_char,_32UL> *)0x0) goto LAB_00dabadf;
    this = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_60;
  }
  SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()(this,local_60._M_head_impl);
LAB_00dabadf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_1c0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_1c0.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_1a8);
  if (*(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             **)(in_FS_OFFSET + 0x28);
  }
LAB_00dabdc2:
  __stack_chk_fail();
}

Assistant:

std::vector<std::unique_ptr<PubkeyProvider>> ParsePubkeyInner(uint32_t key_exp_index, const Span<const char>& sp, ParseScriptContext ctx, FlatSigningProvider& out, bool& apostrophe, std::string& error)
{
    std::vector<std::unique_ptr<PubkeyProvider>> ret;
    bool permit_uncompressed = ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH;
    auto split = Split(sp, '/');
    std::string str(split[0].begin(), split[0].end());
    if (str.size() == 0) {
        error = "No key provided";
        return {};
    }
    if (split.size() == 1) {
        if (IsHex(str)) {
            std::vector<unsigned char> data = ParseHex(str);
            CPubKey pubkey(data);
            if (pubkey.IsValid() && !pubkey.IsValidNonHybrid()) {
                error = "Hybrid public keys are not allowed";
                return {};
            }
            if (pubkey.IsFullyValid()) {
                if (permit_uncompressed || pubkey.IsCompressed()) {
                    ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, false));
                    return ret;
                } else {
                    error = "Uncompressed keys are not allowed";
                    return {};
                }
            } else if (data.size() == 32 && ctx == ParseScriptContext::P2TR) {
                unsigned char fullkey[33] = {0x02};
                std::copy(data.begin(), data.end(), fullkey + 1);
                pubkey.Set(std::begin(fullkey), std::end(fullkey));
                if (pubkey.IsFullyValid()) {
                    ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, true));
                    return ret;
                }
            }
            error = strprintf("Pubkey '%s' is invalid", str);
            return {};
        }
        CKey key = DecodeSecret(str);
        if (key.IsValid()) {
            if (permit_uncompressed || key.IsCompressed()) {
                CPubKey pubkey = key.GetPubKey();
                out.keys.emplace(pubkey.GetID(), key);
                ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, ctx == ParseScriptContext::P2TR));
                return ret;
            } else {
                error = "Uncompressed keys are not allowed";
                return {};
            }
        }
    }
    CExtKey extkey = DecodeExtKey(str);
    CExtPubKey extpubkey = DecodeExtPubKey(str);
    if (!extkey.key.IsValid() && !extpubkey.pubkey.IsValid()) {
        error = strprintf("key '%s' is not valid", str);
        return {};
    }
    std::vector<KeyPath> paths;
    DeriveType type = DeriveType::NO;
    if (std::ranges::equal(split.back(), Span{"*"}.first(1))) {
        split.pop_back();
        type = DeriveType::UNHARDENED;
    } else if (std::ranges::equal(split.back(), Span{"*'"}.first(2)) || std::ranges::equal(split.back(), Span{"*h"}.first(2))) {
        apostrophe = std::ranges::equal(split.back(), Span{"*'"}.first(2));
        split.pop_back();
        type = DeriveType::HARDENED;
    }
    if (!ParseKeyPath(split, paths, apostrophe, error, /*allow_multipath=*/true)) return {};
    if (extkey.key.IsValid()) {
        extpubkey = extkey.Neuter();
        out.keys.emplace(extpubkey.pubkey.GetID(), extkey.key);
    }
    for (auto& path : paths) {
        ret.emplace_back(std::make_unique<BIP32PubkeyProvider>(key_exp_index, extpubkey, std::move(path), type, apostrophe));
    }
    return ret;
}